

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_lmo_parallel1.cpp
# Opt level: O3

int256_t * __thiscall
primesum::pi_lmo_parallel1(int256_t *__return_storage_ptr__,primesum *this,int128_t x,int threads)

{
  ulong *puVar1;
  char *pcVar2;
  pointer piVar3;
  pointer piVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  double alpha;
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  undefined1 x_02 [16];
  undefined1 x_03 [16];
  int256_t res;
  undefined1 auVar14 [16];
  uint128_t uVar15;
  uint128_t uVar16;
  int128_t *piVar17;
  int64_t c;
  pointer piVar18;
  int128_t *piVar19;
  pointer paVar20;
  pointer pcVar21;
  int in_ECX;
  long lVar22;
  int iVar23;
  undefined4 in_register_00000014;
  ulong uVar24;
  ulong uVar25;
  ulong extraout_RDX;
  ulong uVar26;
  int iVar27;
  long lVar28;
  size_type sVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  int iVar35;
  int128_t *piVar36;
  pointer pcVar37;
  uint64_t uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  int iVar44;
  int64_t m;
  long lVar45;
  size_type low;
  uint64_t uVar46;
  bool bVar47;
  bool bVar48;
  bool bVar49;
  undefined4 uVar50;
  undefined4 uVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  size_type __dnew;
  int64_t segments_per_thread;
  int64_t segment_size;
  int256_t s2;
  vector<int,_std::allocator<int>_> primes;
  S2LoadBalancer loadBalancer;
  BitSieve sieve;
  aligned_vector<double> timings;
  vector<int,_std::allocator<int>_> pi;
  vector<int,_std::allocator<int>_> mu;
  vector<primesum::int256_t,_std::allocator<primesum::int256_t>_> phi_total;
  Wheel wheel;
  vector<int,_std::allocator<int>_> lpf;
  aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_> phi;
  aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_> mu_sum;
  int256_t s1;
  int256_t p2;
  undefined8 in_stack_fffffffffffffc68;
  undefined8 in_stack_fffffffffffffc70;
  long local_370;
  ulong local_360;
  ulong local_350;
  int local_344;
  string local_338;
  int128_t *local_318;
  pointer local_310;
  ulong local_308;
  uint64_t local_300;
  uint64_t local_2f8;
  long local_2f0;
  int64_t local_2e8;
  uint64_t local_2e0;
  size_type local_2d8;
  long local_2d0;
  ulong local_2c8;
  ulong local_2c0;
  pointer local_2b8;
  ulong local_2b0;
  pointer local_2a8;
  size_t local_2a0;
  pointer local_298;
  ulong uStack_290;
  ulong local_288;
  long lStack_280;
  size_type local_278;
  long local_270;
  ulong local_268;
  ulong local_260;
  uint64_t local_258;
  vector<int,_std::allocator<int>_> local_250;
  undefined1 local_238 [88];
  BitSieve local_1e0;
  size_type local_1c0;
  double local_1b8;
  long local_1b0;
  uint64_t local_1a8;
  size_t local_1a0;
  long local_198;
  uint64_t local_190;
  vector<primesum::aligned_vector<double>::align_t,_std::allocator<primesum::aligned_vector<double>::align_t>_>
  local_188;
  vector<int,_std::allocator<int>_> local_170;
  int256_t local_158;
  vector<int,_std::allocator<int>_> local_138;
  vector<primesum::int256_t,_std::allocator<primesum::int256_t>_> local_120;
  Wheel local_108;
  double local_f0;
  int256_t *local_e8;
  long local_e0;
  double local_d8;
  long local_d0;
  pointer local_c8;
  vector<int,_std::allocator<int>_> local_c0;
  vector<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t,_std::allocator<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t>_>
  local_a8;
  vector<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t,_std::allocator<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t>_>
  local_90;
  int256_t local_78;
  pointer local_58;
  ulong local_50;
  ulong local_48;
  long local_40;
  
  lVar22 = CONCAT44(in_register_00000014,threads);
  if (-lVar22 < (long)(ulong)((primesum *)0x1 < this)) {
    auVar53._8_8_ = in_stack_fffffffffffffc70;
    auVar53._0_8_ = in_stack_fffffffffffffc68;
    local_e8 = __return_storage_ptr__;
    alpha = get_alpha_lmo(this,(int128_t)auVar53);
    dVar13 = (double)__floattidf(this,lVar22);
    dVar13 = pow(dVar13,0.3333333333333333);
    auVar52 = __fixdfti(SUB84(dVar13,0));
    if ((long)(ulong)(auVar52._0_8_ == 0) <= auVar52._8_8_) {
      do {
        lVar30 = auVar52._8_8_;
        uVar25 = auVar52._0_8_;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar25;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = uVar25;
        lVar28 = SUB168(auVar5 * auVar9,8) + uVar25 * lVar30 * 2;
        auVar53 = __divti3(this,lVar22,uVar25,lVar30);
        uVar39 = (ulong)(auVar53._0_8_ < SUB168(auVar5 * auVar9,0));
        lVar45 = auVar53._8_8_ - lVar28;
        if ((SBORROW8(auVar53._8_8_,lVar28) != SBORROW8(lVar45,uVar39)) ==
            (long)(lVar45 - uVar39) < 0) goto LAB_001217de;
        auVar52._8_8_ = lVar30 + -1 + (ulong)(uVar25 != 0);
        auVar52._0_8_ = uVar25 - 1;
      } while (-lVar30 < (long)(ulong)(1 < uVar25));
      auVar52 = ZEXT816(0);
    }
LAB_001217de:
    do {
      uVar25 = auVar52._0_8_;
      uVar39 = uVar25 + 1;
      lVar45 = auVar52._8_8_ + (ulong)(0xfffffffffffffffe < uVar25);
      auVar52._8_8_ = lVar45;
      auVar52._0_8_ = uVar39;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar39;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = uVar39;
      lVar28 = SUB168(auVar6 * auVar10,8) + uVar39 * lVar45 * 2;
      auVar53 = __divti3(this,lVar22,uVar39,lVar45);
      uVar39 = (ulong)(auVar53._0_8_ < SUB168(auVar6 * auVar10,0));
      lVar45 = auVar53._8_8_ - lVar28;
    } while ((SBORROW8(auVar53._8_8_,lVar28) != SBORROW8(lVar45,uVar39)) ==
             (long)(lVar45 - uVar39) < 0);
    piVar36 = (int128_t *)(long)(alpha * (double)(long)uVar25);
    local_2b0 = (long)piVar36 >> 0x3f;
    c = __divti3(this,lVar22,piVar36);
    local_300 = 6;
    if ((long)piVar36 < 0xd) {
      local_300 = (uint64_t)(int)(&PhiTiny::pi)[(long)piVar36];
    }
    pcVar2 = local_238 + 0x10;
    local_238._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"");
    print((string *)local_238);
    if ((char *)local_238._0_8_ != pcVar2) {
      operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
    }
    local_238._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_238,"=== pi_lmo_parallel1(x) ===","");
    print((string *)local_238);
    if ((char *)local_238._0_8_ != pcVar2) {
      operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
    }
    local_238._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_238,"pi(x) = S1 + S2 + pi(y) - 1 - P2","");
    print((string *)local_238);
    if ((char *)local_238._0_8_ != pcVar2) {
      operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
    }
    x_00._8_8_ = in_stack_fffffffffffffc70;
    x_00._0_8_ = in_stack_fffffffffffffc68;
    print(this,(int128_t)x_00,lVar22,(int64_t)piVar36,c,alpha,(int)local_300);
    x_01._8_8_ = in_stack_fffffffffffffc70;
    x_01._0_8_ = in_stack_fffffffffffffc68;
    P2((int256_t *)&local_58,this,(int128_t)x_01,lVar22,(int)piVar36);
    generate_moebius(&local_138,(int64_t)piVar36);
    generate_lpf(&local_c0,(int64_t)piVar36);
    generate_primes(&local_250,(int64_t)piVar36);
    x_02._8_8_ = in_stack_fffffffffffffc70;
    x_02._0_8_ = in_stack_fffffffffffffc68;
    S1(&local_78,this,(int128_t)x_02,lVar22,(int64_t)piVar36,(int)local_300);
    local_238._8_8_ = 0.0;
    local_238._16_8_ = local_238._16_8_ & 0xffffffffffffff00;
    local_238._0_8_ = pcVar2;
    print((string *)local_238);
    if ((char *)local_238._0_8_ != pcVar2) {
      operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
    }
    local_338._M_dataplus._M_p = (pointer)0x10;
    local_238._0_8_ = pcVar2;
    local_238._0_8_ = std::__cxx11::string::_M_create((ulong *)local_238,(ulong)&local_338);
    local_238._16_8_ = local_338._M_dataplus._M_p;
    builtin_strncpy((char *)local_238._0_8_,"=== S2(x, y) ===",0x10);
    local_238._8_8_ = local_338._M_dataplus._M_p;
    *(char *)(local_238._0_8_ + (long)local_338._M_dataplus._M_p) = '\0';
    print((string *)local_238);
    if ((char *)local_238._0_8_ != pcVar2) {
      operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
    }
    local_338._M_dataplus._M_p = (pointer)0x21;
    local_238._0_8_ = pcVar2;
    local_238._0_8_ = std::__cxx11::string::_M_create((ulong *)local_238,(ulong)&local_338);
    local_238._16_8_ = local_338._M_dataplus._M_p;
    builtin_strncpy((char *)local_238._0_8_,"Computation of the special leaves",0x21);
    local_238._8_8_ = local_338._M_dataplus._M_p;
    *(char *)(local_238._0_8_ + (long)local_338._M_dataplus._M_p) = '\0';
    print((string *)local_238);
    if ((char *)local_238._0_8_ != pcVar2) {
      operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
    }
    local_e0 = __udivti3(this,lVar22,piVar36,local_2b0);
    local_2e0 = local_e0 + 1;
    local_298 = (pointer)0x0;
    uStack_290 = 0;
    local_288 = 0;
    lStack_280 = 0;
    local_344 = ideal_num_threads(in_ECX,local_2e0,100000);
    x_03._8_8_ = in_stack_fffffffffffffc70;
    x_03._0_8_ = in_stack_fffffffffffffc68;
    S2LoadBalancer::S2LoadBalancer
              ((S2LoadBalancer *)local_238,(int128_t)x_03,(int64_t)this,lVar22,(int64_t)piVar36);
    local_2a0 = S2LoadBalancer::get_min_segment_size((S2LoadBalancer *)local_238);
    local_2e8 = 1;
    local_f0 = get_time();
    generate_pi(&local_170,(int64_t)piVar36);
    sVar29 = (long)local_250.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_250.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    local_338.field_2._M_allocated_capacity = 0;
    local_338.field_2._8_8_ = 0;
    local_338._M_dataplus._M_p = (pointer)0x0;
    local_338._M_string_length = 0;
    std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>::vector
              (&local_120,sVar29,(value_type *)&local_338,(allocator_type *)&local_1e0);
    local_318 = piVar36;
    if (1 < (long)local_2e0) {
      local_1b8 = (double)(long)piVar36;
      local_1b0 = local_300 + 1;
      local_2b8 = (pointer)0x0;
      local_d8 = SQRT(local_1b8);
      local_2c0 = 0;
      local_2c8 = 0;
      local_2d0 = 0;
      low = 1;
      do {
        lVar45 = (long)((local_e0 - low) + local_2a0) / (long)local_2a0;
        iVar23 = local_344;
        if (lVar45 < local_344) {
          iVar23 = (int)lVar45;
        }
        if (local_344 < 1) {
          iVar23 = 1;
        }
        sVar29 = (size_type)iVar23;
        lVar45 = (long)(lVar45 + sVar29 + -1) / (long)sVar29;
        if (local_2e8 < lVar45) {
          lVar45 = local_2e8;
        }
        if (local_2e8 < 1) {
          lVar45 = 1;
        }
        local_2e8 = lVar45;
        local_1c0 = low;
        std::
        vector<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t,_std::allocator<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t>_>
        ::vector(&local_a8,sVar29,(allocator_type *)&local_338);
        std::
        vector<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t,_std::allocator<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t>_>
        ::vector(&local_90,sVar29,(allocator_type *)&local_338);
        local_278 = sVar29;
        std::
        vector<primesum::aligned_vector<double>::align_t,_std::allocator<primesum::aligned_vector<double>::align_t>_>
        ::vector(&local_188,sVar29,(allocator_type *)&local_338);
        if (0 < iVar23) {
          local_2d8 = 0;
          do {
            dVar13 = get_time();
            local_d0 = local_2d8 * 0x200;
            local_188.
            super__Vector_base<primesum::aligned_vector<double>::align_t,_std::allocator<primesum::aligned_vector<double>::align_t>_>
            ._M_impl.super__Vector_impl_data._M_start[local_2d8].val[0] = dVar13;
            local_2a8 = local_90.
                        super__Vector_base<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t,_std::allocator<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            local_310 = local_a8.
                        super__Vector_base<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t,_std::allocator<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            local_1a0 = local_2a0;
            lVar45 = local_2e8 * local_2a0;
            uVar38 = lVar45 * local_2d8 + local_1c0;
            auVar53 = __udivti3(this,lVar22,uVar38,(long)uVar38 >> 0x3f);
            uVar25 = auVar53._8_8_;
            dVar13 = (double)__floattidf(auVar53._0_8_,uVar25);
            auVar52 = __fixunsdfti(SUB84(SQRT(dVar13),0));
            piVar19 = (int128_t *)(-(ulong)(auVar52._8_8_ != 0) | auVar52._0_8_);
            uVar39 = 0;
            do {
              auVar7._8_8_ = 0;
              auVar7._0_8_ = piVar19;
              auVar11._8_8_ = 0;
              auVar11._0_8_ = piVar19;
              uVar24 = SUB168(auVar7 * auVar11,8) + (long)piVar19 * uVar39 * 2;
              bVar47 = piVar19 != (int128_t *)0x0;
              piVar17 = piVar19;
              piVar19 = (int128_t *)((long)piVar19 - 1);
              uVar26 = uVar39;
              uVar39 = (uVar39 - 1) + (ulong)bVar47;
            } while (uVar25 < uVar24 ||
                     uVar25 - uVar24 < (ulong)(auVar53._0_8_ < SUB168(auVar7 * auVar11,0)));
            do {
              uVar24 = uVar26;
              piVar19 = piVar17;
              auVar8._8_8_ = 0;
              auVar8._0_8_ = piVar19;
              auVar12._8_8_ = 0;
              auVar12._0_8_ = piVar19;
              auVar14._8_8_ = SUB168(auVar8 * auVar12,8) + (long)piVar19 * uVar24 * 2;
              auVar14._0_8_ = SUB168(auVar8 * auVar12,0);
              uVar39 = SUB168(auVar53 - auVar14,8);
              uVar25 = uVar24 << 1 | (ulong)piVar19 >> 0x3f;
              piVar17 = (int128_t *)((long)piVar19 + 1);
              uVar26 = uVar24 + ((int128_t *)0xfffffffffffffffe < piVar19);
            } while (uVar25 < uVar39 ||
                     uVar25 - uVar39 <
                     (ulong)((ulong)((long)piVar19 * 2) < SUB168(auVar53 - auVar14,0)));
            if (local_2b0 <= uVar24 && (ulong)(piVar19 < piVar36) <= uVar24 - local_2b0) {
              piVar19 = piVar36;
            }
            iVar27 = local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(long)piVar19];
            uVar50 = SUB84(local_d8,0);
            uVar51 = (undefined4)((ulong)local_d8 >> 0x20);
            local_2f8 = uVar38;
            if (local_1b8 < 0.0) {
              dVar13 = sqrt(local_1b8);
              uVar50 = SUB84(dVar13,0);
              uVar51 = (undefined4)((ulong)dVar13 >> 0x20);
            }
            local_310 = local_310 + local_2d8;
            lVar28 = (long)(double)CONCAT44(uVar51,uVar50);
            if (0xb504f332 < lVar28) {
              lVar28 = 0xb504f333;
            }
            lVar30 = lVar28 * 2;
            do {
              lVar30 = lVar30 + -2;
              lVar31 = lVar28 * lVar28;
              lVar28 = lVar28 + -1;
            } while (lVar31 - (long)piVar36 != 0 && (long)piVar36 <= lVar31);
            local_2a8 = local_2a8 + local_2d8;
            do {
              lVar28 = lVar28 + 1;
              lVar30 = lVar30 + 2;
            } while (lVar30 < (long)piVar36 - lVar28 * lVar28);
            iVar27 = iVar27 + 1;
            local_1a8 = lVar45 + local_2f8;
            if ((long)local_2e0 <= (long)local_1a8) {
              local_1a8 = local_2e0;
            }
            sVar29 = (size_type)iVar27;
            local_370 = 0;
            local_350 = 0;
            local_360 = 0;
            uVar39 = 0;
            if (local_1b0 < (long)sVar29) {
              iVar35 = *(int *)((long)local_170.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start + lVar30 * 2);
              iVar44 = local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[(long)piVar36];
              BitSieve::BitSieve(&local_1e0,local_1a0);
              Wheel::Wheel<std::vector<int,std::allocator<int>>>
                        (&local_108,&local_250,sVar29,local_2f8);
              local_338.field_2._M_allocated_capacity = 0;
              local_338.field_2._8_8_ = 0;
              local_338._M_dataplus._M_p = (pointer)0x0;
              local_338._M_string_length = 0;
              std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>::resize
                        (local_310->val,sVar29,(value_type *)&local_338);
              local_338.field_2._M_allocated_capacity = 0;
              local_338.field_2._8_8_ = 0;
              local_338._M_dataplus._M_p = (pointer)0x0;
              local_338._M_string_length = 0;
              std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>::resize
                        (local_2a8->val,sVar29,(value_type *)&local_338);
              local_350 = 0;
              local_360 = 0;
              local_308 = 0;
              local_370 = 0;
              if ((long)local_2f8 < (long)local_1a8) {
                if (iVar27 < iVar35) {
                  iVar35 = iVar27;
                }
                local_270 = (long)iVar35;
                if (iVar27 < iVar44) {
                  iVar44 = iVar27;
                }
                local_198 = (long)iVar44;
                local_308 = 0;
                local_370 = 0;
                local_350 = 0;
                local_360 = 0;
                uVar38 = local_2f8;
                do {
                  local_2f8 = local_1a0 + uVar38;
                  uVar46 = local_2f8;
                  if ((long)local_1a8 < (long)local_2f8) {
                    uVar46 = local_1a8;
                  }
                  BitSieve::pre_sieve(&local_1e0,local_300,uVar38);
                  lVar45 = local_1b0;
                  local_190 = uVar46;
                  if (local_1b0 < local_270) {
                    uVar39 = uVar46 - uVar38;
                    lVar28 = local_1b0;
                    piVar36 = local_318;
                    local_268 = uVar39;
                    do {
                      lVar45 = (long)local_250.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start[lVar28];
                      auVar53 = __udivti3(this,lVar22,uVar46 * lVar45,
                                          (long)(uVar46 * lVar45) >> 0x3f);
                      uVar25 = (long)piVar36 / lVar45;
                      if ((ulong)((long)uVar25 >> 0x3f) < auVar53._8_8_ ||
                          ((long)uVar25 >> 0x3f) - auVar53._8_8_ < (ulong)(uVar25 < auVar53._0_8_))
                      {
                        uVar25 = auVar53._0_8_;
                      }
                      auVar53 = __udivti3(this,lVar22,uVar38 * lVar45,
                                          (long)(uVar38 * lVar45) >> 0x3f);
                      piVar36 = auVar53._0_8_;
                      if (local_2b0 <= auVar53._8_8_ &&
                          (ulong)(auVar53._0_8_ < local_318) <= auVar53._8_8_ - local_2b0) {
                        piVar36 = local_318;
                      }
                      if ((long)piVar36 <= lVar45) goto LAB_0012286d;
                      local_2f0 = lVar45;
                      if ((long)uVar25 < (long)piVar36) {
                        uVar26 = 0;
                        piVar18 = local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start;
                        local_260 = uVar25;
                        do {
                          iVar27 = piVar18[(long)piVar36];
                          if (((long)iVar27 != 0) &&
                             ((int)lVar45 <
                              local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[(long)piVar36])) {
                            lVar45 = (long)piVar36 * lVar45;
                            lVar30 = __udivti3(this,lVar22,lVar45,lVar45 >> 0x3f);
                            piVar3 = local_310->val[0].
                                     super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                            if ((long)uVar26 <= (long)(lVar30 - uVar38)) {
                              local_c8 = piVar3 + lVar28;
                              lVar31 = *(long *)((long)&piVar3[lVar28].high + 8);
                              uVar39 = (ulong)piVar3[lVar28].high;
                              uVar25 = (ulong)piVar3[lVar28].low;
                              uVar24 = *(ulong *)((long)&piVar3[lVar28].low + 8);
                              do {
                                uVar34 = (&BitSieve::set_bit_)[(uint)uVar26 & 0x7f] &
                                         (ulong)(&(((
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  *)local_1e0.sieve_.
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)
                                                [uVar26 >> 7];
                                if (uVar34 != 0) {
                                  uVar34 = uVar26 + uVar38;
                                }
                                uVar40 = (long)uVar34 >> 0x3f;
                                bVar47 = CARRY8(uVar39,uVar40);
                                uVar32 = uVar39 + uVar40;
                                bVar48 = CARRY8(uVar25,uVar34);
                                uVar25 = uVar25 + uVar34;
                                bVar49 = CARRY8(uVar24,uVar40);
                                uVar39 = uVar24 + uVar40;
                                uVar24 = uVar39 + bVar48;
                                uVar34 = (ulong)(bVar49 || CARRY8(uVar39,(ulong)bVar48));
                                uVar39 = uVar32 + uVar34;
                                lVar31 = lVar31 + uVar40 + (ulong)bVar47 +
                                         (ulong)CARRY8(uVar32,uVar34);
                                uVar26 = uVar26 + 2;
                              } while ((long)uVar26 <= (long)(lVar30 - uVar38));
                              *(ulong *)&local_c8->high = uVar39;
                              *(long *)((long)&local_c8->high + 8) = lVar31;
                              *(ulong *)&local_c8->low = uVar25;
                              *(ulong *)((long)&local_c8->low + 8) = uVar24;
                            }
                            local_338._M_dataplus._M_p = (pointer)(iVar27 * lVar45);
                            local_338._M_string_length = (long)local_338._M_dataplus._M_p >> 0x3f;
                            local_338.field_2._M_allocated_capacity = local_338._M_string_length;
                            local_338.field_2._8_8_ = local_338._M_string_length;
                            int256_t::operator*(&local_158,piVar3 + lVar28,(int256_t *)&local_338);
                            bVar47 = local_308 < (ulong)local_158.high;
                            uVar25 = local_308 - (ulong)local_158.high;
                            bVar48 = local_350 < (ulong)local_158.low;
                            local_350 = local_350 - (ulong)local_158.low;
                            bVar49 = local_360 < local_158.low._8_8_;
                            uVar39 = local_360 - local_158.low._8_8_;
                            local_360 = uVar39 - bVar48;
                            uVar39 = (ulong)(bVar49 || uVar39 < bVar48);
                            local_308 = uVar25 - uVar39;
                            local_370 = ((local_370 - local_158.high._8_8_) - (ulong)bVar47) -
                                        (ulong)(uVar25 < uVar39);
                            uVar39 = lVar45 * local_138.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start[(long)piVar36];
                            uVar34 = (long)uVar39 >> 0x3f;
                            piVar4 = local_2a8->val[0].
                                     super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                            lVar45 = *(long *)((long)&piVar4[lVar28].high + 8);
                            uVar15 = piVar4[lVar28].high;
                            uVar32 = -uVar34 + (long)piVar4[lVar28].high;
                            piVar3 = piVar4 + lVar28;
                            uVar16 = piVar3->low;
                            *(ulong *)&piVar3->low = (long)piVar3->low - uVar39;
                            puVar1 = (ulong *)((long)&piVar4[lVar28].low + 8);
                            uVar24 = (ulong)((ulong)uVar16 < uVar39);
                            uVar39 = *puVar1;
                            uVar25 = *puVar1;
                            *puVar1 = (uVar25 - uVar34) - uVar24;
                            uVar39 = (ulong)(uVar39 < uVar34 || uVar25 - uVar34 < uVar24);
                            *(ulong *)&piVar4[lVar28].high = uVar32 - uVar39;
                            *(ulong *)((long)&piVar4[lVar28].high + 8) =
                                 (lVar45 + (ulong)CARRY8(-uVar34,(ulong)uVar15)) -
                                 (ulong)(uVar32 < uVar39);
                            piVar18 = local_138.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start;
                            lVar45 = local_2f0;
                            uVar25 = local_260;
                            uVar39 = local_268;
                          }
                          piVar36 = (int128_t *)((long)piVar36 - 1);
                        } while ((long)uVar25 < (long)piVar36);
                      }
                      else {
                        uVar26 = 0;
                      }
                      uVar46 = local_190;
                      piVar36 = local_318;
                      if ((long)uVar26 < (long)uVar39) {
                        piVar4 = local_310->val[0].
                                 super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                        piVar3 = piVar4 + lVar28;
                        lVar45 = *(long *)((long)&piVar4[lVar28].high + 8);
                        uVar25 = (ulong)piVar4[lVar28].high;
                        uVar24 = (ulong)piVar4[lVar28].low;
                        uVar34 = *(ulong *)((long)&piVar4[lVar28].low + 8);
                        do {
                          uVar32 = (&BitSieve::set_bit_)[(uint)uVar26 & 0x7f] &
                                   (ulong)(&(((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                               *)local_1e0.sieve_.
                                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            )._M_impl.super__Vector_impl_data._M_start)[uVar26 >> 7]
                          ;
                          if (uVar32 != 0) {
                            uVar32 = uVar26 + uVar38;
                          }
                          uVar33 = (long)uVar32 >> 0x3f;
                          bVar47 = CARRY8(uVar25,uVar33);
                          uVar40 = uVar25 + uVar33;
                          bVar48 = CARRY8(uVar24,uVar32);
                          uVar24 = uVar24 + uVar32;
                          bVar49 = CARRY8(uVar34,uVar33);
                          uVar25 = uVar34 + uVar33;
                          uVar34 = uVar25 + bVar48;
                          uVar32 = (ulong)(bVar49 || CARRY8(uVar25,(ulong)bVar48));
                          uVar25 = uVar40 + uVar32;
                          lVar45 = lVar45 + uVar33 + (ulong)bVar47 + (ulong)CARRY8(uVar40,uVar32);
                          uVar26 = uVar26 + 2;
                        } while ((long)uVar26 < (long)uVar39);
                        *(ulong *)&piVar3->high = uVar25;
                        *(long *)((long)&piVar3->high + 8) = lVar45;
                        *(ulong *)&piVar3->low = uVar24;
                        *(ulong *)((long)&piVar3->low + 8) = uVar34;
                        lVar45 = local_2f0;
                      }
                      anon_unknown.dwarf_ef25d::cross_off
                                ((BitSieve *)
                                 local_1e0.sieve_.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start,uVar38,local_190,lVar45,
                                 local_108.wheel_.
                                 super__Vector_base<primesum::WheelItem,_std::allocator<primesum::WheelItem>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar28);
                      lVar28 = lVar28 + 1;
                      lVar45 = local_270;
                    } while (lVar28 != local_270);
                  }
                  if (lVar45 < local_198) {
                    local_2f0 = uVar46 - uVar38;
                    local_258 = uVar38;
                    do {
                      piVar18 = local_250.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start;
                      iVar27 = local_250.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[lVar45];
                      uVar39 = (ulong)iVar27;
                      auVar53 = __udivti3(this,lVar22,uVar38 * uVar39,
                                          (long)(uVar38 * uVar39) >> 0x3f);
                      piVar36 = local_318;
                      piVar19 = auVar53._0_8_;
                      if (local_2b0 <= auVar53._8_8_ &&
                          (ulong)(auVar53._0_8_ < local_318) <= auVar53._8_8_ - local_2b0) {
                        piVar19 = local_318;
                      }
                      lVar28 = (long)local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start[(long)piVar19];
                      auVar53 = __udivti3(this,lVar22,uVar46 * uVar39,
                                          (long)(uVar46 * uVar39) >> 0x3f);
                      uVar25 = (long)piVar36 / (long)uVar39;
                      if ((long)piVar36 / (long)uVar39 <= (long)uVar39) {
                        uVar25 = uVar39;
                      }
                      if ((ulong)((long)uVar25 >> 0x3f) < auVar53._8_8_ ||
                          ((long)uVar25 >> 0x3f) - auVar53._8_8_ < (ulong)(uVar25 < auVar53._0_8_))
                      {
                        uVar25 = auVar53._0_8_;
                      }
                      iVar35 = piVar18[lVar28];
                      if (iVar35 <= iVar27) break;
                      lVar30 = (long)iVar35;
                      uVar24 = 0;
                      uVar26 = uVar39;
                      if ((long)uVar25 < lVar30) {
                        do {
                          local_260 = uVar26;
                          local_268 = uVar25;
                          uVar38 = local_258;
                          lVar30 = __udivti3(this,lVar22,lVar30 * uVar39,
                                             (long)(lVar30 * uVar39) >> 0x3f);
                          uVar39 = local_260;
                          lVar30 = lVar30 - uVar38;
                          piVar3 = local_310->val[0].
                                   super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                          if ((long)uVar24 <= lVar30) {
                            piVar4 = piVar3 + lVar45;
                            lVar31 = *(long *)((long)&piVar3[lVar45].high + 8);
                            uVar25 = (ulong)piVar3[lVar45].high;
                            uVar26 = (ulong)piVar3[lVar45].low;
                            uVar34 = *(ulong *)((long)&piVar3[lVar45].low + 8);
                            do {
                              uVar32 = (&BitSieve::set_bit_)[(uint)uVar24 & 0x7f] &
                                       (ulong)(&(((
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  *)local_1e0.sieve_.
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                )._M_impl.super__Vector_impl_data._M_start)
                                              [uVar24 >> 7];
                              if (uVar32 != 0) {
                                uVar32 = uVar38 + uVar24;
                              }
                              uVar33 = (long)uVar32 >> 0x3f;
                              bVar47 = CARRY8(uVar25,uVar33);
                              uVar40 = uVar25 + uVar33;
                              bVar48 = CARRY8(uVar26,uVar32);
                              uVar26 = uVar26 + uVar32;
                              bVar49 = CARRY8(uVar34,uVar33);
                              uVar25 = uVar34 + uVar33;
                              uVar34 = uVar25 + bVar48;
                              uVar32 = (ulong)(bVar49 || CARRY8(uVar25,(ulong)bVar48));
                              uVar25 = uVar40 + uVar32;
                              lVar31 = lVar31 + uVar33 + (ulong)bVar47 +
                                       (ulong)CARRY8(uVar40,uVar32);
                              uVar24 = uVar24 + 2;
                            } while ((long)uVar24 <= lVar30);
                            *(ulong *)&piVar4->high = uVar25;
                            *(long *)((long)&piVar4->high + 8) = lVar31;
                            *(ulong *)&piVar4->low = uVar26;
                            *(ulong *)((long)&piVar4->low + 8) = uVar34;
                          }
                          local_338._M_dataplus._M_p = (pointer)((long)iVar35 * local_260);
                          local_338._M_string_length = (long)local_338._M_dataplus._M_p >> 0x3f;
                          local_338.field_2._M_allocated_capacity = local_338._M_string_length;
                          local_338.field_2._8_8_ = local_338._M_string_length;
                          int256_t::operator*(&local_158,piVar3 + lVar45,(int256_t *)&local_338);
                          bVar47 = CARRY8(local_308,(ulong)local_158.high);
                          uVar26 = local_308 + (ulong)local_158.high;
                          bVar48 = CARRY8(local_350,(ulong)local_158.low);
                          local_350 = local_350 + (ulong)local_158.low;
                          bVar49 = CARRY8(local_360,local_158.low._8_8_);
                          uVar25 = local_360 + local_158.low._8_8_;
                          local_360 = uVar25 + bVar48;
                          uVar25 = (ulong)(bVar49 || CARRY8(uVar25,(ulong)bVar48));
                          local_308 = uVar26 + uVar25;
                          local_370 = local_370 + local_158.high._8_8_ + (ulong)bVar47 +
                                      (ulong)CARRY8(uVar26,uVar25);
                          uVar25 = (long)local_250.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start[lVar28] * uVar39;
                          uVar40 = (long)uVar25 >> 0x3f;
                          piVar4 = local_2a8->val[0].
                                   super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                          uVar34 = (ulong)piVar4[lVar45].high;
                          uVar33 = uVar34 + uVar40;
                          lVar30 = *(long *)((long)&piVar4[lVar45].high + 8);
                          piVar3 = piVar4 + lVar45;
                          uVar15 = piVar3->low;
                          *(ulong *)&piVar3->low = (long)piVar3->low + uVar25;
                          puVar1 = (ulong *)((long)&piVar4[lVar45].low + 8);
                          uVar32 = (ulong)CARRY8((ulong)uVar15,uVar25);
                          uVar26 = *puVar1;
                          uVar25 = *puVar1;
                          *puVar1 = uVar25 + uVar40 + uVar32;
                          uVar25 = (ulong)(CARRY8(uVar26,uVar40) || CARRY8(uVar25 + uVar40,uVar32));
                          *(ulong *)&piVar4[lVar45].high = uVar33 + uVar25;
                          *(ulong *)((long)&piVar4[lVar45].high + 8) =
                               lVar30 + uVar40 + (ulong)CARRY8(uVar34,uVar40) +
                               (ulong)CARRY8(uVar33,uVar25);
                          iVar35 = local_250.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[lVar28 + -1];
                          lVar28 = lVar28 + -1;
                          lVar30 = (long)iVar35;
                          uVar25 = local_268;
                          uVar26 = local_260;
                        } while ((long)local_268 < lVar30);
                      }
                      uVar46 = local_190;
                      uVar38 = local_258;
                      if ((long)uVar24 < local_2f0) {
                        piVar4 = local_310->val[0].
                                 super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                        piVar3 = piVar4 + lVar45;
                        lVar28 = *(long *)((long)&piVar4[lVar45].high + 8);
                        uVar25 = (ulong)piVar4[lVar45].high;
                        uVar26 = (ulong)piVar4[lVar45].low;
                        uVar34 = *(ulong *)((long)&piVar4[lVar45].low + 8);
                        do {
                          uVar32 = (&BitSieve::set_bit_)[(uint)uVar24 & 0x7f] &
                                   (ulong)(&(((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                               *)local_1e0.sieve_.
                                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            )._M_impl.super__Vector_impl_data._M_start)[uVar24 >> 7]
                          ;
                          if (uVar32 != 0) {
                            uVar32 = local_258 + uVar24;
                          }
                          uVar33 = (long)uVar32 >> 0x3f;
                          bVar47 = CARRY8(uVar25,uVar33);
                          uVar40 = uVar25 + uVar33;
                          bVar48 = CARRY8(uVar26,uVar32);
                          uVar26 = uVar26 + uVar32;
                          bVar49 = CARRY8(uVar34,uVar33);
                          uVar25 = uVar34 + uVar33;
                          uVar34 = uVar25 + bVar48;
                          uVar32 = (ulong)(bVar49 || CARRY8(uVar25,(ulong)bVar48));
                          uVar25 = uVar40 + uVar32;
                          lVar28 = lVar28 + uVar33 + (ulong)bVar47 + (ulong)CARRY8(uVar40,uVar32);
                          uVar24 = uVar24 + 2;
                        } while ((long)uVar24 < local_2f0);
                        *(ulong *)&piVar3->high = uVar25;
                        *(long *)((long)&piVar3->high + 8) = lVar28;
                        *(ulong *)&piVar3->low = uVar26;
                        *(ulong *)((long)&piVar3->low + 8) = uVar34;
                      }
                      anon_unknown.dwarf_ef25d::cross_off
                                ((BitSieve *)
                                 local_1e0.sieve_.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start,local_258,local_190,uVar39
                                 ,local_108.wheel_.
                                  super__Vector_base<primesum::WheelItem,_std::allocator<primesum::WheelItem>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar45);
                      lVar45 = lVar45 + 1;
                    } while (lVar45 != local_198);
                  }
LAB_0012286d:
                  uVar38 = local_2f8;
                } while ((long)local_2f8 < (long)local_1a8);
              }
              if (local_108.wheel_.
                  super__Vector_base<primesum::WheelItem,_std::allocator<primesum::WheelItem>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_108.wheel_.
                                super__Vector_base<primesum::WheelItem,_std::allocator<primesum::WheelItem>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_108.wheel_.
                                      super__Vector_base<primesum::WheelItem,_std::allocator<primesum::WheelItem>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_108.wheel_.
                                      super__Vector_base<primesum::WheelItem,_std::allocator<primesum::WheelItem>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              piVar36 = local_318;
              uVar39 = local_308;
              if ((BitSieve *)
                  local_1e0.sieve_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                  ._M_impl.super__Vector_impl_data._M_start != (BitSieve *)0x0) {
                operator_delete(local_1e0.sieve_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_1e0.sieve_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_1e0.sieve_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
                uVar39 = local_308;
              }
            }
            bVar47 = CARRY8(local_2c8,uVar39);
            uVar39 = local_2c8 + uVar39;
            bVar48 = CARRY8((ulong)local_2b8,local_350);
            local_2b8 = local_2b8 + local_350;
            bVar49 = CARRY8(local_2c0,local_360);
            local_360 = local_2c0 + local_360;
            local_2c0 = local_360 + bVar48;
            uVar25 = (ulong)(bVar49 || CARRY8(local_360,(ulong)bVar48));
            local_2c8 = uVar39 + uVar25;
            local_2d0 = local_2d0 + local_370 + (ulong)bVar47 + (ulong)CARRY8(uVar39,uVar25);
            local_298 = local_2b8;
            uStack_290 = local_2c0;
            local_288 = local_2c8;
            lStack_280 = local_2d0;
            dVar13 = get_time();
            *(double *)
             ((long)(local_188.
                     super__Vector_base<primesum::aligned_vector<double>::align_t,_std::allocator<primesum::aligned_vector<double>::align_t>_>
                     ._M_impl.super__Vector_impl_data._M_start)->val + local_d0) =
                 dVar13 - *(double *)
                           ((long)(local_188.
                                   super__Vector_base<primesum::aligned_vector<double>::align_t,_std::allocator<primesum::aligned_vector<double>::align_t>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->val + local_d0);
            local_2d8 = local_2d8 + 1;
          } while (local_2d8 != local_278);
          sVar29 = 0;
          paVar20 = local_a8.
                    super__Vector_base<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t,_std::allocator<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            if (0x20 < (ulong)((long)paVar20[sVar29].val[0].
                                     super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)paVar20[sVar29].val[0].
                                    super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>
                                    ._M_impl.super__Vector_impl_data._M_start)) {
              uVar39 = 1;
              lVar45 = 0x20;
              do {
                int256_t::operator*((int256_t *)&local_338,
                                    (int256_t *)
                                    ((long)&(local_90.
                                             super__Vector_base<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t,_std::allocator<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t>_>
                                             ._M_impl.super__Vector_impl_data._M_start[sVar29].val
                                             [0].
                                             super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->low +
                                    lVar45),(int256_t *)
                                            ((long)&(local_120.
                                                                                                          
                                                  super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->low +
                                            lVar45));
                bVar47 = CARRY8(local_2c8,local_338.field_2._M_allocated_capacity);
                uVar26 = local_2c8 + local_338.field_2._M_allocated_capacity;
                bVar48 = CARRY8((ulong)local_2b8,(ulong)local_338._M_dataplus._M_p);
                local_2b8 = local_2b8 + local_338._M_dataplus._M_p;
                bVar49 = CARRY8(local_2c0,local_338._M_string_length);
                uVar25 = local_2c0 + local_338._M_string_length;
                local_2c0 = uVar25 + bVar48;
                uVar25 = (ulong)(bVar49 || CARRY8(uVar25,(ulong)bVar48));
                local_2c8 = uVar26 + uVar25;
                local_2d0 = local_2d0 + local_338.field_2._8_8_ + (ulong)bVar47 +
                            (ulong)CARRY8(uVar26,uVar25);
                piVar3 = local_a8.
                         super__Vector_base<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t,_std::allocator<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t>_>
                         ._M_impl.super__Vector_impl_data._M_start[sVar29].val[0].
                         super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                lVar28 = *(long *)((long)&piVar3->high + lVar45 + 8U);
                uVar26 = *(ulong *)((long)&piVar3->high + lVar45);
                puVar1 = (ulong *)((long)&(local_120.
                                           super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->high + lVar45
                                  );
                uVar24 = *puVar1;
                uVar33 = uVar26 + *puVar1;
                lVar30 = *(long *)((long)&(local_120.
                                           super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->high +
                                  lVar45 + 8);
                uVar34 = *(ulong *)((long)&piVar3->low + lVar45);
                uVar32 = *(ulong *)((long)&piVar3->low + lVar45 + 8);
                puVar1 = (ulong *)((long)&(local_120.
                                           super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->low + lVar45)
                ;
                uVar25 = *puVar1;
                *puVar1 = *puVar1 + uVar34;
                puVar1 = (ulong *)((long)&(local_120.
                                           super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->low +
                                  lVar45 + 8);
                uVar34 = (ulong)CARRY8(uVar25,uVar34);
                uVar25 = *puVar1;
                uVar40 = *puVar1 + uVar32;
                *puVar1 = uVar40 + uVar34;
                uVar25 = (ulong)(CARRY8(uVar25,uVar32) || CARRY8(uVar40,uVar34));
                *(ulong *)((long)&(local_120.
                                   super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->high + lVar45) =
                     uVar33 + uVar25;
                *(ulong *)((long)&(local_120.
                                   super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->high + lVar45 + 8) =
                     lVar28 + lVar30 + (ulong)CARRY8(uVar26,uVar24) + (ulong)CARRY8(uVar33,uVar25);
                uVar39 = uVar39 + 1;
                lVar45 = lVar45 + 0x20;
                paVar20 = local_a8.
                          super__Vector_base<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t,_std::allocator<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                local_298 = local_2b8;
                uStack_290 = local_2c0;
                local_288 = local_2c8;
                lStack_280 = local_2d0;
              } while (uVar39 < (ulong)((long)local_a8.
                                              super__Vector_base<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t,_std::allocator<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t>_>
                                              ._M_impl.super__Vector_impl_data._M_start[sVar29].val
                                              [0].
                                              super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)piVar3 >> 5));
            }
            sVar29 = sVar29 + 1;
          } while (sVar29 != local_278);
        }
        low = local_1c0 + local_2e8 * local_278 * local_2a0;
        sVar29 = low;
        S2LoadBalancer::update
                  ((S2LoadBalancer *)local_238,low,local_278,(int64_t *)&local_2a0,&local_2e8,
                   (aligned_vector<double> *)&local_188);
        piVar36 = local_318;
        if (local_188.
            super__Vector_base<primesum::aligned_vector<double>::align_t,_std::allocator<primesum::aligned_vector<double>::align_t>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          sVar29 = (long)local_188.
                         super__Vector_base<primesum::aligned_vector<double>::align_t,_std::allocator<primesum::aligned_vector<double>::align_t>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage -
                   (long)local_188.
                         super__Vector_base<primesum::aligned_vector<double>::align_t,_std::allocator<primesum::aligned_vector<double>::align_t>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          operator_delete(local_188.
                          super__Vector_base<primesum::aligned_vector<double>::align_t,_std::allocator<primesum::aligned_vector<double>::align_t>_>
                          ._M_impl.super__Vector_impl_data._M_start,sVar29);
        }
        std::
        vector<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t,_std::allocator<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t>_>
        ::~vector(&local_90);
        std::
        vector<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t,_std::allocator<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t>_>
        ::~vector(&local_a8);
        local_344 = iVar23;
      } while ((long)low < (long)local_2e0);
    }
    local_338._M_string_length = 2;
    local_338.field_2._M_allocated_capacity._0_3_ = 0x3253;
    res.low._8_8_ = uStack_290;
    res.low._0_8_ = local_298;
    res.high._0_8_ = local_288;
    res.high._8_8_ = lStack_280;
    local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
    print(&local_338,res,local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != &local_338.field_2) {
      sVar29 = local_338.field_2._M_allocated_capacity + 1;
      operator_delete(local_338._M_dataplus._M_p,sVar29);
    }
    if (local_120.super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      sVar29 = (long)local_120.
                     super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage -
               (long)local_120.
                     super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      operator_delete(local_120.
                      super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>.
                      _M_impl.super__Vector_impl_data._M_start,sVar29);
    }
    if (local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      sVar29 = (long)local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage -
               (long)local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
      operator_delete(local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,sVar29);
    }
    lVar22 = lStack_280;
    uVar24 = local_288;
    uVar26 = uStack_290;
    pcVar21 = local_298;
    piVar36 = prime_sum_tiny(local_318,sVar29);
    __return_storage_ptr__ = local_e8;
    uVar32 = uVar24 + (ulong)local_78.high;
    pcVar37 = pcVar21 + (ulong)local_78.low;
    uVar39 = (ulong)CARRY8((ulong)pcVar21,(ulong)local_78.low);
    uVar25 = uVar26 + local_78.low._8_8_;
    uVar41 = uVar25 + uVar39;
    uVar39 = (ulong)(CARRY8(uVar26,local_78.low._8_8_) || CARRY8(uVar25,uVar39));
    uVar40 = uVar32 + uVar39;
    uVar34 = (long)extraout_RDX >> 0x3f;
    uVar33 = uVar40 + uVar34;
    pcVar21 = (pointer)((long)piVar36 + (long)pcVar37);
    uVar25 = (ulong)CARRY8((ulong)piVar36,(ulong)pcVar37);
    uVar26 = uVar41 + extraout_RDX;
    uVar42 = uVar26 + uVar25;
    uVar25 = (ulong)(CARRY8(uVar41,extraout_RDX) || CARRY8(uVar26,uVar25));
    uVar41 = uVar33 + uVar25;
    pcVar37 = pcVar21 + 0xffffffffffffffff;
    uVar26 = (ulong)(pcVar21 == (pointer)0x0);
    uVar43 = uVar42 - uVar26;
    uVar26 = (ulong)(uVar42 < uVar26);
    uVar42 = uVar41 - uVar26;
    lVar45 = uVar42 - local_48;
    lVar22 = (((uVar34 + lVar22 + local_78.high._8_8_ + (ulong)CARRY8(uVar24,(ulong)local_78.high) +
                         (ulong)CARRY8(uVar32,uVar39) + (ulong)CARRY8(uVar40,uVar34) +
               (ulong)CARRY8(uVar33,uVar25)) - (ulong)(uVar41 < uVar26)) - local_40) -
             (ulong)(uVar42 < local_48);
    uVar39 = (ulong)(pcVar37 < local_58);
    uVar25 = uVar43 - local_50;
    *(long *)&local_e8->high = lVar45;
    *(long *)((long)&local_e8->high + 8) = lVar22;
    *(long *)&local_e8->low = (long)pcVar37 - (long)local_58;
    *(ulong *)((long)&local_e8->low + 8) = uVar25 - uVar39;
    if (uVar43 < local_50 || uVar25 < uVar39) {
      *(long *)&local_e8->high = lVar45 + -1;
      *(ulong *)((long)&local_e8->high + 8) = lVar22 + -1 + (ulong)(lVar45 != 0);
    }
    if (local_250.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_250.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_250.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_250.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_138.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  else {
    *(undefined8 *)&__return_storage_ptr__->high = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->high + 8) = 0;
    *(undefined8 *)&__return_storage_ptr__->low = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->low + 8) = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

int256_t pi_lmo_parallel1(int128_t x, int threads)
{
  if (x < 2)
    return 0;

  double alpha = get_alpha_lmo(x);
  int64_t x13 = iroot<3>(x);
  int64_t y = (int64_t) (x13 * alpha);
  int64_t z = x / y;
  int64_t c = PhiTiny::get_c(y);

  print("");
  print("=== pi_lmo_parallel1(x) ===");
  print("pi(x) = S1 + S2 + pi(y) - 1 - P2");
  print(x, y, z, c, alpha, threads);

  int256_t p2 = P2(x, y, threads);
  vector<int32_t> mu = generate_moebius(y);
  vector<int32_t> lpf = generate_lpf(y);
  vector<int32_t> primes = generate_primes(y);

  int256_t s1 = S1(x, y, c, threads);
  int256_t s2 = S2(x, y, c, primes, lpf, mu, threads);
  int256_t phi = s1 + s2;
  int256_t sum = phi + prime_sum_tiny(y) - 1 - p2;

  return sum;
}